

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

Vertex __thiscall geometrycentral::surface::SurfaceMesh::getNewVertex(SurfaceMesh *this)

{
  size_t sVar1;
  size_type __new_size;
  _List_node_base *p_Var2;
  Vertex VVar3;
  size_type local_30;
  
  if (this->nVerticesCapacityCount <= this->nVerticesFillCount) {
    __new_size = this->nVerticesCapacityCount * 2;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->vHalfedgeArr,__new_size);
    if (this->useImplicitTwinFlag == false) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->vHeInStartArr,__new_size);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (&this->vHeOutStartArr,__new_size);
    }
    this->nVerticesCapacityCount = __new_size;
    p_Var2 = (this->vertexExpandCallbackList).
             super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 != (_List_node_base *)&this->vertexExpandCallbackList) {
      do {
        local_30 = __new_size;
        if (p_Var2[2]._M_next == (_List_node_base *)0x0) {
          ::std::__throw_bad_function_call();
        }
        (*(code *)p_Var2[2]._M_prev)(p_Var2 + 1,&local_30);
        p_Var2 = p_Var2->_M_next;
      } while (p_Var2 != (_List_node_base *)&this->vertexExpandCallbackList);
    }
  }
  sVar1 = this->nVerticesFillCount;
  this->nVerticesFillCount = sVar1 + 1;
  this->nVerticesCount = this->nVerticesCount + 1;
  this->modificationTick = this->modificationTick + 1;
  this->isCompressedFlag = false;
  VVar3.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       sVar1;
  VVar3.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
       = this;
  return (Vertex)VVar3.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
  ;
}

Assistant:

Vertex SurfaceMesh::getNewVertex() {

  // The boring case, when no resize is needed
  if (nVerticesFillCount < nVerticesCapacityCount) {
    // No work needed
  }
  // The intesting case, where vectors resize
  else {
    size_t newCapacity = nVerticesCapacityCount * 2;

    // Resize internal arrays
    vHalfedgeArr.resize(newCapacity);
    if (!usesImplicitTwin()) {
      vHeInStartArr.resize(newCapacity);
      vHeOutStartArr.resize(newCapacity);
    }

    nVerticesCapacityCount = newCapacity;


    // Invoke relevant callback functions
    for (auto& f : vertexExpandCallbackList) {
      f(newCapacity);
    }
  }

  nVerticesFillCount++;
  nVerticesCount++;

  modificationTick++;
  isCompressedFlag = false;
  return Vertex(this, nVerticesFillCount - 1);
}